

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_hdr_write(htsFile *hfp,bcf_hdr_t *h)

{
  BGZF *fp_00;
  char *data;
  ssize_t sVar1;
  BGZF *fp;
  char *htxt;
  bcf_hdr_t *pbStack_20;
  int hlen;
  bcf_hdr_t *h_local;
  htsFile *hfp_local;
  
  pbStack_20 = h;
  h_local = (bcf_hdr_t *)hfp;
  if (h->dirty != 0) {
    bcf_hdr_sync(h);
  }
  if ((*(int *)((long)&h_local->samples + 4) == 8) || (*(int *)((long)&h_local->samples + 4) == 2))
  {
    hfp_local._4_4_ = vcf_hdr_write((htsFile *)h_local,pbStack_20);
  }
  else {
    data = bcf_hdr_fmt_text(pbStack_20,1,(int *)((long)&htxt + 4));
    htxt._4_4_ = htxt._4_4_ + 1;
    fp_00 = (BGZF *)h_local->dict[2];
    sVar1 = bgzf_write(fp_00,"BCF\x02\x02",5);
    if (sVar1 == 5) {
      sVar1 = bgzf_write(fp_00,(void *)((long)&htxt + 4),4);
      if (sVar1 == 4) {
        sVar1 = bgzf_write(fp_00,data,(long)htxt._4_4_);
        if (sVar1 == htxt._4_4_) {
          free(data);
          hfp_local._4_4_ = 0;
        }
        else {
          hfp_local._4_4_ = -1;
        }
      }
      else {
        hfp_local._4_4_ = -1;
      }
    }
    else {
      hfp_local._4_4_ = -1;
    }
  }
  return hfp_local._4_4_;
}

Assistant:

int bcf_hdr_write(htsFile *hfp, bcf_hdr_t *h)
{
    if ( h->dirty ) bcf_hdr_sync(h);
    if (hfp->format.format == vcf || hfp->format.format == text_format)
        return vcf_hdr_write(hfp, h);

    int hlen;
    char *htxt = bcf_hdr_fmt_text(h, 1, &hlen);
    hlen++; // include the \0 byte

    BGZF *fp = hfp->fp.bgzf;
    if ( bgzf_write(fp, "BCF\2\2", 5) !=5 ) return -1;
    if ( bgzf_write(fp, &hlen, 4) !=4 ) return -1;
    if ( bgzf_write(fp, htxt, hlen) != hlen ) return -1;

    free(htxt);
    return 0;
}